

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryHeap.hpp
# Opt level: O0

uint __thiscall
Lib::
BinaryHeap<Indexing::UnresolvedSplitRecord,_Indexing::BindingComparator<Inferences::ALASCA::Demodulation::Lhs>_>
::bubbleDown(BinaryHeap<Indexing::UnresolvedSplitRecord,_Indexing::BindingComparator<Inferences::ALASCA::Demodulation::Lhs>_>
             *this,uint index)

{
  uint uVar1;
  Comparison CVar2;
  uint uVar3;
  uint in_ESI;
  UnresolvedSplitRecord *in_RDI;
  uint nextIndex;
  
  uVar1 = in_ESI << 1;
  do {
    uVar3 = uVar1;
    if (in_RDI->var < uVar3) {
      return in_ESI;
    }
    if ((uVar3 == in_RDI->var) ||
       (CVar2 = Indexing::BindingComparator<Inferences::ALASCA::Demodulation::Lhs>::compare
                          ((UnresolvedSplitRecord *)CONCAT44(in_ESI,uVar3),in_RDI), CVar2 != GREATER
       )) {
      CVar2 = Indexing::BindingComparator<Inferences::ALASCA::Demodulation::Lhs>::compare
                        ((UnresolvedSplitRecord *)CONCAT44(in_ESI,uVar3),in_RDI);
      if (CVar2 != GREATER) {
        return in_ESI;
      }
      std::swap<Indexing::UnresolvedSplitRecord>
                ((UnresolvedSplitRecord *)(*(long *)(in_RDI + 1) + (ulong)in_ESI * 0x10),
                 (UnresolvedSplitRecord *)(*(long *)(in_RDI + 1) + (ulong)uVar3 * 0x10));
    }
    else {
      CVar2 = Indexing::BindingComparator<Inferences::ALASCA::Demodulation::Lhs>::compare
                        ((UnresolvedSplitRecord *)CONCAT44(in_ESI,uVar3),in_RDI);
      if (CVar2 == GREATER) {
        std::swap<Indexing::UnresolvedSplitRecord>
                  ((UnresolvedSplitRecord *)(*(long *)(in_RDI + 1) + (ulong)in_ESI * 0x10),
                   (UnresolvedSplitRecord *)(*(long *)(in_RDI + 1) + (ulong)uVar3 * 0x10));
      }
      else {
        std::swap<Indexing::UnresolvedSplitRecord>
                  ((UnresolvedSplitRecord *)(*(long *)(in_RDI + 1) + (ulong)in_ESI * 0x10),
                   (UnresolvedSplitRecord *)(*(long *)(in_RDI + 1) + (ulong)(uVar3 | 1) * 0x10));
        uVar3 = uVar3 | 1;
      }
    }
    uVar1 = uVar3 << 1;
    in_ESI = uVar3;
  } while( true );
}

Assistant:

unsigned bubbleDown(unsigned index)
  {
    ASS(index>0 && index<=_size);
    unsigned nextIndex=index<<1;
    while(nextIndex<=_size) {
      if(nextIndex!=_size && Comparator::compare(_data1[index], _data1[nextIndex|1])==GREATER) {
	if(Comparator::compare(_data1[nextIndex|1], _data1[nextIndex])==GREATER) {
	  std::swap(_data1[index], _data1[nextIndex]);
	} else {
	  std::swap(_data1[index], _data1[nextIndex|1]);
	  nextIndex|=1;
	}
      } else if(Comparator::compare(_data1[index], _data1[nextIndex])==GREATER) {
	std::swap(_data1[index], _data1[nextIndex]);
      } else {
	return index;
      }
      index=nextIndex;
      nextIndex=index<<1;
    }
    return index;
  }